

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O1

void LCDReadNData(uint16_t *pwBuf,uint32_t ulSizeWordCnt)

{
  byte bVar1;
  ulong uVar2;
  
  LCDWaitForReady();
  bcm2835_gpio_write('\b','\0');
  bcm2835_spi_transfer('\x10');
  bcm2835_spi_transfer('\0');
  LCDWaitForReady();
  bVar1 = bcm2835_spi_transfer('\0');
  *pwBuf = (ushort)bVar1;
  bVar1 = bcm2835_spi_transfer('\0');
  *pwBuf = (ushort)bVar1;
  LCDWaitForReady();
  if (ulSizeWordCnt != 0) {
    uVar2 = 0;
    do {
      bVar1 = bcm2835_spi_transfer('\0');
      pwBuf[uVar2] = (ushort)bVar1 << 8;
      bVar1 = bcm2835_spi_transfer('\0');
      pwBuf[uVar2] = pwBuf[uVar2] | (ushort)bVar1;
      uVar2 = uVar2 + 1;
    } while (ulSizeWordCnt != uVar2);
  }
  bcm2835_gpio_write('\b','\x01');
  return;
}

Assistant:

void LCDReadNData(uint16_t* pwBuf, uint32_t ulSizeWordCnt)
{
	uint32_t i;
	
	uint16_t wPreamble = 0x1000;

	LCDWaitForReady();
	
	bcm2835_gpio_write(CS,LOW);

	bcm2835_spi_transfer(wPreamble>>8);
	bcm2835_spi_transfer(wPreamble);
	
	LCDWaitForReady();
	
	pwBuf[0]=bcm2835_spi_transfer(0x00);//dummy
	pwBuf[0]=bcm2835_spi_transfer(0x00);//dummy
	
	LCDWaitForReady();
	
	for(i=0;i<ulSizeWordCnt;i++)
	{
		pwBuf[i] = bcm2835_spi_transfer(0x00)<<8;
		pwBuf[i] |= bcm2835_spi_transfer(0x00);
	}
	
	bcm2835_gpio_write(CS,HIGH); 
}